

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O1

void __thiscall absl::lts_20250127::Mutex::LockSlow(Mutex *this,MuHow how,Condition *cond,int flags)

{
  bool bVar1;
  int iVar2;
  
  if (_DAT_0085d104 == 0) {
    iVar2 = base_internal::NumCPUs();
    _DAT_0085d104 = -(uint)(iVar2 < 2) | 0x5dc;
  }
  bVar1 = LockSlowWithDeadline(this,how,cond,(KernelTimeout)0xffffffffffffffff,flags);
  if (bVar1) {
    return;
  }
  raw_log_internal::RawLog
            (kFatal,"mutex.cc",0x73a,"Check %s failed: %s",
             "this->LockSlowWithDeadline(how, cond, KernelTimeout::Never(), flags)",
             "condition untrue on return from LockSlow");
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/synchronization/mutex.cc"
                ,0x73a,"void absl::Mutex::LockSlow(MuHow, const Condition *, int)");
}

Assistant:

ABSL_ATTRIBUTE_NOINLINE void Mutex::LockSlow(MuHow how, const Condition* cond,
                                             int flags) {
  // Note: we specifically initialize spinloop_iterations after the first use
  // in TryAcquireWithSpinning so that Lock function does not have any non-tail
  // calls and consequently a stack frame. It's fine to have spinloop_iterations
  // uninitialized (meaning no spinning) in all initial uncontended Lock calls
  // and in the first contended call. After that we will have
  // spinloop_iterations properly initialized.
  if (ABSL_PREDICT_FALSE(
          globals.spinloop_iterations.load(std::memory_order_relaxed) == 0)) {
    if (absl::base_internal::NumCPUs() > 1) {
      // If this is multiprocessor, allow spinning.
      globals.spinloop_iterations.store(1500, std::memory_order_relaxed);
    } else {
      // If this a uniprocessor, only yield/sleep.
      globals.spinloop_iterations.store(-1, std::memory_order_relaxed);
    }
  }
  ABSL_RAW_CHECK(
      this->LockSlowWithDeadline(how, cond, KernelTimeout::Never(), flags),
      "condition untrue on return from LockSlow");
}